

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

cpool * cpool_get_instance(Curl_easy *data)

{
  Curl_share *pCVar1;
  cpool *pcVar2;
  
  if (data == (Curl_easy *)0x0) {
    return (cpool *)0x0;
  }
  pCVar1 = data->share;
  if ((pCVar1 != (Curl_share *)0x0) && ((pCVar1->specifier & 0x20) != 0)) {
    return &pCVar1->cpool;
  }
  if (data->multi_easy != (Curl_multi *)0x0) {
    return &data->multi_easy->cpool;
  }
  pcVar2 = &data->multi->cpool;
  if (data->multi == (Curl_multi *)0x0) {
    pcVar2 = (cpool *)0x0;
  }
  return pcVar2;
}

Assistant:

static struct cpool *cpool_get_instance(struct Curl_easy *data)
{
  if(data) {
    if(CURL_SHARE_KEEP_CONNECT(data->share))
      return &data->share->cpool;
    else if(data->multi_easy)
      return &data->multi_easy->cpool;
    else if(data->multi)
      return &data->multi->cpool;
  }
  return NULL;
}